

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

ostream * wasm::printStackIR(StackIR *ir,ostream *o,Function *func)

{
  uint uVar1;
  StackInst *pSVar2;
  Expression *pEVar3;
  uintptr_t uVar4;
  bool bVar5;
  int iVar6;
  pointer ppSVar7;
  uint *puVar8;
  ulong uVar9;
  ostream *o_00;
  char *pcVar10;
  char cVar11;
  long lVar12;
  ulong uVar13;
  Name name;
  Name name_00;
  undefined1 local_90 [8];
  SmallVector<unsigned_int,_4UL> catchIndexStack;
  ostream **local_50;
  pointer local_48;
  ostream *local_40;
  undefined4 local_38;
  
  local_90 = (undefined1  [8])0x0;
  catchIndexStack.fixed._M_elems[2] = 0;
  catchIndexStack.fixed._M_elems[3] = 0;
  catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppSVar7 = (ir->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ir->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppSVar7) {
    iVar6 = 0;
    cVar11 = (func != (Function *)0x0) * '\x02';
    uVar9 = 0;
    uVar13 = 1;
    catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)func;
    do {
      pSVar2 = ppSVar7[uVar9];
      if (pSVar2 == (StackInst *)0x0) goto LAB_0084ad5e;
      switch(pSVar2->op) {
      case Basic:
        local_50 = &local_40;
        std::__cxx11::string::_M_construct((ulong)&local_50,cVar11);
        std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_50,(long)local_48);
        if (local_50 != &local_40) {
          operator_delete(local_50,(ulong)(local_40 + 1));
        }
        if (pSVar2->origin->_id != PopId) {
          local_50 = (ostream **)0x0;
          local_48 = catchIndexStack.flexible.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          local_38 = 0x1efff;
          local_40 = o;
          Visitor<wasm::PrintExpressionContents,_void>::visit
                    ((Visitor<wasm::PrintExpressionContents,_void> *)&local_50,pSVar2->origin);
        }
        break;
      case IfElse:
        local_50 = &local_40;
        std::__cxx11::string::_M_construct((ulong)&local_50,cVar11 + -1);
        std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_50,(long)local_48);
        if (local_50 != &local_40) {
          operator_delete(local_50,(ulong)(local_40 + 1));
        }
        Colors::outputColorCode(o,"\x1b[35m");
        lVar12 = 4;
        Colors::outputColorCode(o,"\x1b[1m");
        pcVar10 = "else";
        goto LAB_0084ac9c;
      case TryBegin:
        local_50 = (ostream **)((ulong)local_50 & 0xffffffff00000000);
        SmallVector<unsigned_int,_4UL>::push_back
                  ((SmallVector<unsigned_int,_4UL> *)local_90,(uint *)&local_50);
      case BlockBegin:
      case IfBegin:
      case LoopBegin:
        local_50 = &local_40;
        std::__cxx11::string::_M_construct((ulong)&local_50,cVar11);
        std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_50,(long)local_48);
        if (local_50 != &local_40) {
          operator_delete(local_50,(ulong)(local_40 + 1));
        }
        local_50 = (ostream **)0x0;
        local_48 = catchIndexStack.flexible.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        local_38 = 0x1efff;
        local_40 = o;
        Visitor<wasm::PrintExpressionContents,_void>::visit
                  ((Visitor<wasm::PrintExpressionContents,_void> *)&local_50,pSVar2->origin);
        iVar6 = iVar6 + 1;
        cVar11 = cVar11 + '\x01';
        break;
      case Catch:
        local_50 = &local_40;
        std::__cxx11::string::_M_construct((ulong)&local_50,cVar11 + -1);
        std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_50,(long)local_48);
        if (local_50 != &local_40) {
          operator_delete(local_50,(ulong)(local_40 + 1));
        }
        Colors::outputColorCode(o,"\x1b[35m");
        Colors::outputColorCode(o,"\x1b[1m");
        std::__ostream_insert<char,std::char_traits<char>>(o,"catch ",6);
        Colors::outputColorCode(o,"\x1b[0m");
        pEVar3 = pSVar2->origin;
        if (pEVar3->_id != TryId) {
LAB_0084add5:
          __assert_fail("int(_id) == int(T::SpecificId)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                        ,0x314,"T *wasm::Expression::cast() [T = wasm::Try]");
        }
        puVar8 = SmallVector<unsigned_int,_4UL>::back((SmallVector<unsigned_int,_4UL> *)local_90);
        uVar1 = *puVar8;
        *puVar8 = uVar1 + 1;
        if (*(ulong *)(pEVar3 + 3) <= (ulong)uVar1) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                       );
        }
        uVar4 = pEVar3[2].type.id;
        o_00 = (ostream *)((ulong)uVar1 * 0x10);
        name_00.super_IString.str._M_str = (char *)o;
        name_00.super_IString.str._M_len = *(size_t *)(o_00 + uVar4 + 8);
        anon_unknown_217::printName(*(anon_unknown_217 **)(o_00 + uVar4),name_00,o_00);
        break;
      case CatchAll:
        local_50 = &local_40;
        std::__cxx11::string::_M_construct((ulong)&local_50,cVar11 + -1);
        std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_50,(long)local_48);
        if (local_50 != &local_40) {
          operator_delete(local_50,(ulong)(local_40 + 1));
        }
        Colors::outputColorCode(o,"\x1b[35m");
        lVar12 = 9;
        Colors::outputColorCode(o,"\x1b[1m");
        pcVar10 = "catch_all";
LAB_0084ac9c:
        std::__ostream_insert<char,std::char_traits<char>>(o,pcVar10,lVar12);
        Colors::outputColorCode(o,"\x1b[0m");
        break;
      case Delegate:
        cVar11 = cVar11 + -1;
        local_50 = &local_40;
        std::__cxx11::string::_M_construct((ulong)&local_50,cVar11);
        std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_50,(long)local_48);
        if (local_50 != &local_40) {
          operator_delete(local_50,(ulong)(local_40 + 1));
        }
        Colors::outputColorCode(o,"\x1b[35m");
        Colors::outputColorCode(o,"\x1b[1m");
        std::__ostream_insert<char,std::char_traits<char>>(o,"delegate ",9);
        Colors::outputColorCode(o,"\x1b[0m");
        pEVar3 = pSVar2->origin;
        if (pEVar3->_id != TryId) goto LAB_0084add5;
        iVar6 = iVar6 + -1;
        if (*(ostream **)(pEVar3 + 7) == DAT_00dbd310) {
          std::ostream::operator<<(o,iVar6);
        }
        else {
          name.super_IString.str._M_str = (char *)o;
          name.super_IString.str._M_len = *(size_t *)(pEVar3 + 7);
          anon_unknown_217::printName
                    ((anon_unknown_217 *)pEVar3[6].type.id,name,*(ostream **)(pEVar3 + 7));
        }
        break;
      case TryEnd:
        if ((pointer)catchIndexStack.fixed._M_elems._8_8_ ==
            catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (local_90 == (undefined1  [8])0x0) {
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                          ,0x51,
                          "void wasm::SmallVector<unsigned int, 4>::pop_back() [T = unsigned int, N = 4]"
                         );
          }
          local_90 = (undefined1  [8])((long)local_90 - 1);
        }
        else {
          catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start =
               catchIndexStack.flexible.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + -1;
        }
      case BlockEnd:
      case IfEnd:
      case LoopEnd:
        cVar11 = cVar11 + -1;
        local_50 = &local_40;
        std::__cxx11::string::_M_construct((ulong)&local_50,cVar11);
        std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_50,(long)local_48);
        if (local_50 != &local_40) {
          operator_delete(local_50,(ulong)(local_40 + 1));
        }
        Colors::outputColorCode(o,"\x1b[35m");
        Colors::outputColorCode(o,"\x1b[1m");
        std::__ostream_insert<char,std::char_traits<char>>(o,"end",3);
        Colors::outputColorCode(o,"\x1b[0m");
        iVar6 = iVar6 + -1;
        break;
      default:
        handle_unreachable("unexpeted op",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                           ,0xe94);
      }
      local_50 = (ostream **)CONCAT71(local_50._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(o,(char *)&local_50,1);
LAB_0084ad5e:
      ppSVar7 = (ir->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      bVar5 = uVar13 < (ulong)((long)(ir->
                                     super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7 >>
                              3);
      uVar9 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar5);
    if (iVar6 != 0) {
      __assert_fail("controlFlowDepth == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                    ,0xe98,"std::ostream &wasm::printStackIR(StackIR *, std::ostream &, Function *)"
                   );
    }
  }
  if (catchIndexStack.fixed._M_elems._8_8_ != 0) {
    operator_delete((void *)catchIndexStack.fixed._M_elems._8_8_,
                    (long)catchIndexStack.flexible.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - catchIndexStack.fixed._M_elems._8_8_);
  }
  return o;
}

Assistant:

static std::ostream&
printStackIR(StackIR* ir, std::ostream& o, Function* func) {
  size_t indent = func ? 2 : 0;
  auto doIndent = [&]() { o << std::string(indent, ' '); };

  int controlFlowDepth = 0;
  // Stack to track indices of catches within a try
  SmallVector<Index, 4> catchIndexStack;
  for (Index i = 0; i < (*ir).size(); i++) {
    auto* inst = (*ir)[i];
    if (!inst) {
      continue;
    }
    switch (inst->op) {
      case StackInst::Basic: {
        doIndent();
        // Pop is a pseudo instruction and should not be printed in the stack IR
        // format to make it valid wat form.
        if (inst->origin->is<Pop>()) {
          break;
        }

        PrintExpressionContents(func, o).visit(inst->origin);
        break;
      }
      case StackInst::TryBegin:
        catchIndexStack.push_back(0);
        [[fallthrough]];
      case StackInst::BlockBegin:
      case StackInst::IfBegin:
      case StackInst::LoopBegin: {
        controlFlowDepth++;
        doIndent();
        PrintExpressionContents(func, o).visit(inst->origin);
        indent++;
        break;
      }
      case StackInst::TryEnd:
        catchIndexStack.pop_back();
        [[fallthrough]];
      case StackInst::BlockEnd:
      case StackInst::IfEnd:
      case StackInst::LoopEnd: {
        controlFlowDepth--;
        indent--;
        doIndent();
        printMedium(o, "end");
        break;
      }
      case StackInst::IfElse: {
        indent--;
        doIndent();
        printMedium(o, "else");
        indent++;
        break;
      }
      case StackInst::Catch: {
        indent--;
        doIndent();
        printMedium(o, "catch ");
        Try* curr = inst->origin->cast<Try>();
        printName(curr->catchTags[catchIndexStack.back()++], o);
        indent++;
        break;
      }
      case StackInst::CatchAll: {
        indent--;
        doIndent();
        printMedium(o, "catch_all");
        indent++;
        break;
      }
      case StackInst::Delegate: {
        controlFlowDepth--;
        indent--;
        doIndent();
        printMedium(o, "delegate ");
        Try* curr = inst->origin->cast<Try>();
        if (curr->delegateTarget == DELEGATE_CALLER_TARGET) {
          o << controlFlowDepth;
        } else {
          printName(curr->delegateTarget, o);
        }
        break;
      }
      default:
        WASM_UNREACHABLE("unexpeted op");
    }
    o << '\n';
  }
  assert(controlFlowDepth == 0);
  return o;
}